

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::SelfTestData::MergeFrom(SelfTestData *this,SelfTestData *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  void *pvVar2;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0xaac);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    pvVar2 = this_00->ptr_;
    if (((ulong)pvVar2 & 1) == 0) {
      pbVar3 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar3,*(ulong *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::TypeHandler>
            (&(this->samples_).super_RepeatedPtrFieldBase,
             &(from->samples_).super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void SelfTestData::MergeFrom(const SelfTestData& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SelfTestData)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  samples_.MergeFrom(from.samples_);
}